

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,4u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  uint original;
  uint uVar3;
  ushort uVar4;
  uint recent;
  uint uVar5;
  byte bVar6;
  ushort uVar7;
  int delta;
  
  for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar5 != 0x20; uVar5 = uVar5 + 1) {
      if (uVar5 < uVar3) {
        if ((int)(uVar3 - uVar5) < 8 - bias) {
LAB_00101e32:
          uVar2 = (ushort)uVar5;
          uVar1 = (ushort)(uVar3 & 0xf);
          uVar7 = uVar2 & 0x10 | uVar1;
          uVar4 = uVar2 & 0xf;
          if (uVar4 < uVar1) {
            if ((ushort)(8 - bias) <= (ushort)(uVar1 - uVar4)) {
              uVar7 = uVar7 - 0x10;
            }
          }
          else if ((ushort)(bias + 8) < (ushort)(uVar4 - uVar1)) {
            uVar7 = uVar7 + 0x10;
          }
          if ((uVar7 != (ushort)uVar3) ||
             ((bias == 0 &&
              (bVar6 = (char)(uVar3 & 0xf) - (char)uVar5,
              (ushort)(((bVar6 & 0xf) + uVar2) - (ushort)(bVar6 * '\x02' & 0x10)) != (ushort)uVar3))
             )) goto LAB_00101eb3;
        }
      }
      else if ((int)(uVar5 - uVar3) <= bias + 8) goto LAB_00101e32;
    }
  }
LAB_00101eb3:
  return 0x1f < uVar3;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}